

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_f100d8::cURLProgressHelper::UpdatePercentage
          (cURLProgressHelper *this,cm_curl_off_t value,cm_curl_off_t total,string *status)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  cmAlphaNum *pcVar4;
  long val;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string local_f0;
  undefined1 local_d0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_98;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  size_t local_50;
  string *local_48;
  cmAlphaNum *local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  
  if (0 < total) {
    lVar1 = this->CurrentPercentage;
    lVar3 = lround(((double)value / (double)total) * 100.0);
    val = 100;
    if (lVar3 < 100) {
      val = lVar3;
    }
    this->CurrentPercentage = val;
    if (lVar1 == val) {
      bVar2 = false;
    }
    else {
      local_98.first._M_len = 1;
      local_98.first._M_str = "[";
      local_98.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_78 = (this->Text)._M_dataplus._M_p;
      local_80 = (this->Text)._M_string_length;
      local_70 = 0;
      local_68 = 1;
      local_60 = " ";
      local_58 = 0;
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_d0,val);
      pcVar4 = (cmAlphaNum *)(local_d0 + 0x10);
      if ((cmAlphaNum *)local_d0._0_8_ != (cmAlphaNum *)0x0) {
        pcVar4 = (cmAlphaNum *)local_d0._0_8_;
      }
      local_48 = pcVar4->RValueString_;
      pcVar4 = (cmAlphaNum *)local_d0;
      if ((cmAlphaNum *)local_d0._0_8_ != (cmAlphaNum *)0x0) {
        pcVar4 = (cmAlphaNum *)local_d0._0_8_;
      }
      local_50 = (pcVar4->View_)._M_len;
      local_40 = (cmAlphaNum *)local_d0._0_8_;
      local_38 = 0xb;
      local_30 = "% complete]";
      local_28 = 0;
      views._M_len = 5;
      views._M_array = &local_98;
      cmCatViews(&local_f0,views);
      std::__cxx11::string::operator=((string *)status,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool UpdatePercentage(cm_curl_off_t value, cm_curl_off_t total,
                        std::string& status)
  {
    long OldPercentage = this->CurrentPercentage;

    if (total > 0) {
      this->CurrentPercentage = std::lround(
        static_cast<double>(value) / static_cast<double>(total) * 100.0);
      if (this->CurrentPercentage > 100) {
        // Avoid extra progress reports for unexpected data beyond total.
        this->CurrentPercentage = 100;
      }
    }

    bool updated = (OldPercentage != this->CurrentPercentage);

    if (updated) {
      status =
        cmStrCat("[", this->Text, " ", this->CurrentPercentage, "% complete]");
    }

    return updated;
  }